

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O3

void __thiscall
pass_dead_code_elimination_2_Test::~pass_dead_code_elimination_2_Test
          (pass_dead_code_elimination_2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(pass, dead_code_elimination_2) {
    // remove statements inside scopes
    Context ctx;
    auto &mod = ctx.generator("mod");
    auto &a = mod.var("a", 1);
    auto &b = mod.var("b", 1);
    auto &c = mod.var("c", 1);
    mod.wire(a, b);
    auto const &comb = mod.combinational();
    comb->add_stmt(c.assign(a));

    dead_code_elimination(&mod);
    EXPECT_TRUE(mod.get_vars().empty());
    EXPECT_TRUE(mod.get_all_stmts().empty());
}